

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Own<kj::ReadableFile,_std::nullptr_t> __thiscall kj::newDiskReadableFile(kj *this,OwnFd *fd)

{
  undefined8 *puVar1;
  ReadableFile *extraout_RDX;
  Own<kj::ReadableFile,_std::nullptr_t> OVar2;
  
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = &PTR_getFd_00710cc8;
  *(int *)(puVar1 + 1) = fd->fd;
  fd->fd = -1;
  *puVar1 = &PTR_getFd_00710328;
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::DiskReadableFile>::instance;
  *(undefined8 **)(this + 8) = puVar1;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<ReadableFile> newDiskReadableFile(kj::OwnFd fd) {
  return heap<DiskReadableFile>(kj::mv(fd));
}